

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::vector<duckdb::Value,true>>
          (Serializer *this,vector<duckdb::vector<duckdb::Value,_true>,_true> *vec)

{
  pointer pvVar1;
  vector<duckdb::Value,_true> *item;
  pointer vec_00;
  
  (*this->_vptr_Serializer[8])
            (this,((long)(vec->
                         super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                         ).
                         super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->
                         super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                         ).
                         super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar1 = (vec->
           super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
           ).
           super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (vec_00 = (vec->
                super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                ).
                super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; vec_00 != pvVar1; vec_00 = vec_00 + 1) {
    WriteValue<duckdb::Value>(this,vec_00);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}